

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_server_close(nni_http_server *s)

{
  nni_http_server *s_local;
  
  if ((s->closed & 1U) == 0) {
    s->closed = true;
    nni_aio_close(&s->accaio);
    if (s->listener != (nng_stream_listener *)0x0) {
      nng_stream_listener_close(s->listener);
    }
  }
  return;
}

Assistant:

static void
http_server_close(nni_http_server *s)
{
	if (s->closed) {
		return;
	}
	s->closed = true;

	nni_aio_close(&s->accaio);

	// Close the TCP endpoint that is listening.
	if (s->listener) {
		nng_stream_listener_close(s->listener);
	}
}